

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_generator.cc
# Opt level: O2

string * grpc_ts_generator::GenerateInterface
                   (string *__return_storage_ptr__,File *file,Service *service,string *filename)

{
  Printer *pPVar1;
  Service *pSVar2;
  char cVar3;
  int iVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  uint uVar7;
  allocator<char> local_1d9;
  long *local_1d8;
  Printer *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  Printer *local_1b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_3;
  key_type local_178;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  string *local_110;
  Service *local_108;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_1;
  string local_d0;
  string local_b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generated_functions;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  generated_functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &generated_functions._M_t._M_impl.super__Rb_tree_header._M_header;
  generated_functions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  generated_functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  generated_functions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110 = __return_storage_ptr__;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  generated_functions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       generated_functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (*(file->super_CommentHolder)._vptr_CommentHolder[7])(&vars_3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars_2,"PATH",(allocator<char> *)&vars_1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&vars_2);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_3);
  std::__cxx11::string::~string((string *)&vars_2);
  std::__cxx11::string::~string((string *)&vars_3);
  (*(file->super_CommentHolder)._vptr_CommentHolder[7])(&vars_3,file);
  std::__cxx11::string::~string((string *)&vars_3);
  if (vars_3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vars_3,"PATH",(allocator<char> *)&vars_2);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&vars_3);
    std::__cxx11::string::append((char *)pmVar5);
    std::__cxx11::string::~string((string *)&vars_3);
  }
  (*(service->super_CommentHolder)._vptr_CommentHolder[6])(&vars_3,service);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars_2,"ServiceName",(allocator<char> *)&vars_1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&vars_2);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_3);
  std::__cxx11::string::~string((string *)&vars_2);
  std::__cxx11::string::~string((string *)&vars_3);
  (*(service->super_CommentHolder)._vptr_CommentHolder[6])(&vars_2,service);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars_3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars_2,"_fbs"
                );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars_1,"FBSFile",(allocator<char> *)&local_178);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&vars_1);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_3);
  std::__cxx11::string::~string((string *)&vars_1);
  std::__cxx11::string::~string((string *)&vars_3);
  std::__cxx11::string::~string((string *)&vars_2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars_3,"Filename",(allocator<char> *)&vars_2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&vars_3);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&vars_3);
  (*(file->super_CommentHolder)._vptr_CommentHolder[0xc])(&local_1b0,file,local_110);
  anon_unknown_0::GenerateImports(service,local_1b0,&vars,false);
  pPVar1 = local_1b0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&vars_1._M_t,&vars._M_t);
  (*pPVar1->_vptr_Printer[2])
            (pPVar1,&vars_1,
             "interface I$ServiceName$Service extends grpc.ServiceDefinition<grpc.UntypedServiceImplementation> {\n"
            );
  (*pPVar1->_vptr_Printer[5])(pPVar1);
  for (uVar7 = 0; iVar4 = (*(service->super_CommentHolder)._vptr_CommentHolder[8])(service),
      (int)uVar7 < iVar4; uVar7 = uVar7 + 1) {
    (*(service->super_CommentHolder)._vptr_CommentHolder[9])(&local_178,service,(ulong)uVar7);
    (**(code **)(*(long *)local_178._M_dataplus._M_p + 0x28))((string *)&vars_3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vars_2,"MethodName",(allocator<char> *)&local_b0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars_1,(key_type *)&vars_2);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_3);
    std::__cxx11::string::~string((string *)&vars_2);
    std::__cxx11::string::~string((string *)&vars_3);
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,&vars_1,"$MethodName$: I$ServiceName$Service_I$MethodName$;\n");
    if ((long *)local_178._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_178._M_dataplus._M_p + 8))();
    }
  }
  (*pPVar1->_vptr_Printer[6])(pPVar1);
  (*pPVar1->_vptr_Printer[3])(pPVar1,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&vars_2._M_t,&vars_1._M_t);
  uVar7 = 0;
  local_108 = service;
  while (iVar4 = (*(local_108->super_CommentHolder)._vptr_CommentHolder[8])(), (int)uVar7 < iVar4) {
    (*(local_108->super_CommentHolder)._vptr_CommentHolder[9])(&local_1d8,local_108,(ulong)uVar7);
    cVar3 = (**(code **)(*local_1d8 + 0x80))();
    if (cVar3 == '\0') {
      (**(code **)(*local_1d8 + 0x90))();
    }
    local_1d0 = (Printer *)CONCAT44(local_1d0._4_4_,uVar7);
    cVar3 = (**(code **)(*local_1d8 + 0x88))();
    if (cVar3 == '\0') {
      (**(code **)(*local_1d8 + 0x90))();
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vars_3,"ClientStreaming",(allocator<char> *)&local_178);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars_2._M_t,(string *)&vars_3);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&vars_3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vars_3,"ServerStreaming",(allocator<char> *)&local_178);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars_2._M_t,(string *)&vars_3);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&vars_3);
    (**(code **)(*local_1d8 + 0x28))((string *)&vars_3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"MethodName",&local_1d9)
    ;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars_2._M_t,&local_178);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_3);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&vars_3);
    (**(code **)(*local_1d8 + 0x60))(&local_128);
    (**(code **)(*local_1d8 + 0x68))(&local_b0);
    anon_unknown_0::GenerateNamespace((string *)&vars_3,&local_128,&local_b0,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"OUTPUT",&local_1d9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars_2._M_t,&local_178);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_3);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&vars_3);
    std::__cxx11::string::~string((string *)&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    (**(code **)(*local_1d8 + 0x50))(&local_1c8);
    (**(code **)(*local_1d8 + 0x58))(&local_d0);
    anon_unknown_0::GenerateNamespace((string *)&vars_3,&local_1c8,&local_d0,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"INPUT",&local_1d9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars_2._M_t,&local_178);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_3);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&vars_3);
    std::__cxx11::string::~string((string *)&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&vars_3,&vars_2._M_t);
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,(string *)&vars_3,
               "interface I$ServiceName$Service_I$MethodName$ extends grpc.MethodDefinition<$INPUT$, $OUTPUT$> {\n"
              );
    (*pPVar1->_vptr_Printer[5])(pPVar1);
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,(string *)&vars_3,"path: string; // /$PATH$$ServiceName$/$MethodName$\n");
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,(string *)&vars_3,"requestStream: boolean; // $ClientStreaming$\n");
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,(string *)&vars_3,"responseStream: boolean; // $ServerStreaming$\n");
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,(string *)&vars_3,"requestSerialize: grpc.serialize<$INPUT$>;\n");
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,(string *)&vars_3,"requestDeserialize: grpc.deserialize<$INPUT$>;\n");
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,(string *)&vars_3,"responseSerialize: grpc.serialize<$OUTPUT$>;\n");
    (*pPVar1->_vptr_Printer[2])
              (pPVar1,(string *)&vars_3,"responseDeserialize: grpc.deserialize<$OUTPUT$>;\n");
    (*pPVar1->_vptr_Printer[6])(pPVar1);
    (*pPVar1->_vptr_Printer[3])(pPVar1,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&vars_3);
    (*pPVar1->_vptr_Printer[3])(pPVar1,"\n");
    if (local_1d8 != (long *)0x0) {
      (**(code **)(*local_1d8 + 8))();
    }
    uVar7 = (int)local_1d0 + 1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars_2._M_t);
  (*pPVar1->_vptr_Printer[3])(pPVar1,"\n");
  pSVar2 = local_108;
  (*pPVar1->_vptr_Printer[2])
            (pPVar1,&vars_1,"export const $ServiceName$Service: I$ServiceName$Service;\n");
  (*pPVar1->_vptr_Printer[3])(pPVar1,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&vars_3._M_t,&vars_1._M_t);
  (*pPVar1->_vptr_Printer[2])
            (pPVar1,&vars_3,
             "export interface I$ServiceName$Server extends grpc.UntypedServiceImplementation {\n");
  (*pPVar1->_vptr_Printer[5])(pPVar1);
  uVar7 = 0;
  do {
    iVar4 = (*(pSVar2->super_CommentHolder)._vptr_CommentHolder[8])(pSVar2);
    if (iVar4 <= (int)uVar7) {
      (*pPVar1->_vptr_Printer[6])(pPVar1);
      (*pPVar1->_vptr_Printer[3])(pPVar1,"}\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars_3._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars_1._M_t);
      (*local_1b0->_vptr_Printer[3])(local_1b0,"\n");
      pPVar1 = local_1b0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&vars_3._M_t,&vars._M_t);
      (*pPVar1->_vptr_Printer[2])(pPVar1,&vars_3,"export interface I$ServiceName$Client {\n");
      (*pPVar1->_vptr_Printer[5])(pPVar1);
      local_1d0 = pPVar1;
      for (uVar7 = 0; iVar4 = (*(pSVar2->super_CommentHolder)._vptr_CommentHolder[8])(pSVar2),
          pPVar1 = local_1d0, (int)uVar7 < iVar4; uVar7 = uVar7 + 1) {
        (*(pSVar2->super_CommentHolder)._vptr_CommentHolder[9])(&local_1c8,pSVar2,(ulong)uVar7);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x28))
                  ((string *)&vars_2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vars_1,"MethodName",(allocator<char> *)&local_1d8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars_3,(key_type *)&vars_1);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
        std::__cxx11::string::~string((string *)&vars_1);
        std::__cxx11::string::~string((string *)&vars_2);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x60))
                  (&local_d0);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x68))
                  (&local_178);
        anon_unknown_0::GenerateNamespace
                  ((string *)&vars_2,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_d0,&local_178,false);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vars_1,"OUTPUT",(allocator<char> *)&local_1d8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars_3,(key_type *)&vars_1);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
        std::__cxx11::string::~string((string *)&vars_1);
        std::__cxx11::string::~string((string *)&vars_2);
        std::__cxx11::string::~string((string *)&local_178);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d0);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x50))
                  (&local_128);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x58))
                  (&local_b0);
        anon_unknown_0::GenerateNamespace((string *)&vars_2,&local_128,&local_b0,false);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vars_1,"INPUT",(allocator<char> *)&local_1d8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars_3,(key_type *)&vars_1);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
        std::__cxx11::string::~string((string *)&vars_1);
        std::__cxx11::string::~string((string *)&vars_2);
        std::__cxx11::string::~string((string *)&local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vars_2,"ISPUBLIC",(allocator<char> *)&vars_1);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars_3,(string *)&vars_2);
        std::__cxx11::string::assign((char *)pmVar5);
        std::__cxx11::string::~string((string *)&vars_2);
        cVar3 = (**(code **)(((local_1c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x78)
                )();
        if (cVar3 == '\0') {
          cVar3 = (**(code **)(((local_1c8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                              0x90))();
          if (cVar3 == '\0') {
            cVar3 = (**(code **)(((local_1c8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                                0x80))();
            if (cVar3 == '\0') {
              cVar3 = (**(code **)(((local_1c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                                  0x88))();
              if (cVar3 != '\0') {
                anon_unknown_0::GenerateClientReadableStreamInterface(local_1d0,&vars_3);
              }
            }
            else {
              anon_unknown_0::GenerateClientWriteStreamInterface(local_1d0,&vars_3);
            }
          }
          else {
            anon_unknown_0::GenerateDepluxStreamInterface(local_1d0,&vars_3);
          }
        }
        else {
          anon_unknown_0::GenerateUnaryClientInterface(local_1d0,&vars_3);
        }
        if (local_1c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((local_1c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
        }
      }
      (*local_1d0->_vptr_Printer[6])(local_1d0);
      (*pPVar1->_vptr_Printer[3])(pPVar1,"}\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars_3._M_t);
      (*local_1b0->_vptr_Printer[3])(local_1b0,"\n");
      pPVar1 = local_1b0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&vars_3._M_t,&vars._M_t);
      (*pPVar1->_vptr_Printer[2])
                (pPVar1,&vars_3,
                 "export class $ServiceName$Client extends grpc.Client implements I$ServiceName$Client {\n"
                );
      (*pPVar1->_vptr_Printer[5])(pPVar1);
      (*pPVar1->_vptr_Printer[3])
                (pPVar1,
                 "constructor(address: string, credentials: grpc.ChannelCredentials, options?: object);\n"
                );
      local_1d0 = pPVar1;
      for (uVar7 = 0; iVar4 = (*(pSVar2->super_CommentHolder)._vptr_CommentHolder[8])(pSVar2),
          pPVar1 = local_1d0, (int)uVar7 < iVar4; uVar7 = uVar7 + 1) {
        (*(pSVar2->super_CommentHolder)._vptr_CommentHolder[9])(&local_1c8,pSVar2,(ulong)uVar7);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x28))
                  ((string *)&vars_2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vars_1,"MethodName",(allocator<char> *)&local_1d8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars_3,(key_type *)&vars_1);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
        std::__cxx11::string::~string((string *)&vars_1);
        std::__cxx11::string::~string((string *)&vars_2);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x60))
                  (&local_d0);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x68))
                  (&local_178);
        anon_unknown_0::GenerateNamespace
                  ((string *)&vars_2,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_d0,&local_178,false);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vars_1,"OUTPUT",(allocator<char> *)&local_1d8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars_3,(key_type *)&vars_1);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
        std::__cxx11::string::~string((string *)&vars_1);
        std::__cxx11::string::~string((string *)&vars_2);
        std::__cxx11::string::~string((string *)&local_178);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d0);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x50))
                  (&local_128);
        (**(code **)(((local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x58))
                  (&local_b0);
        anon_unknown_0::GenerateNamespace((string *)&vars_2,&local_128,&local_b0,false);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vars_1,"INPUT",(allocator<char> *)&local_1d8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars_3,(key_type *)&vars_1);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
        std::__cxx11::string::~string((string *)&vars_1);
        std::__cxx11::string::~string((string *)&vars_2);
        std::__cxx11::string::~string((string *)&local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vars_2,"ISPUBLIC",(allocator<char> *)&vars_1);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars_3,(string *)&vars_2);
        std::__cxx11::string::assign((char *)pmVar5);
        std::__cxx11::string::~string((string *)&vars_2);
        cVar3 = (**(code **)(((local_1c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 0x78)
                )();
        if (cVar3 == '\0') {
          cVar3 = (**(code **)(((local_1c8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                              0x90))();
          if (cVar3 == '\0') {
            cVar3 = (**(code **)(((local_1c8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                                0x80))();
            if (cVar3 == '\0') {
              cVar3 = (**(code **)(((local_1c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                                  0x88))();
              if (cVar3 != '\0') {
                anon_unknown_0::GenerateClientReadableStreamInterface(local_1d0,&vars_3);
              }
            }
            else {
              anon_unknown_0::GenerateClientWriteStreamInterface(local_1d0,&vars_3);
            }
          }
          else {
            anon_unknown_0::GenerateDepluxStreamInterface(local_1d0,&vars_3);
          }
        }
        else {
          anon_unknown_0::GenerateUnaryClientInterface(local_1d0,&vars_3);
        }
        if (local_1c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((local_1c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
        }
      }
      (*local_1d0->_vptr_Printer[6])(local_1d0);
      (*pPVar1->_vptr_Printer[3])(pPVar1,"}\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars_3._M_t);
      if (local_1b0 != (Printer *)0x0) {
        (*local_1b0->_vptr_Printer[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&generated_functions._M_t);
      return local_110;
    }
    (*(pSVar2->super_CommentHolder)._vptr_CommentHolder[9])(&local_1d8,pSVar2,(ulong)uVar7);
    (**(code **)(*local_1d8 + 0x28))((string *)&vars_2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"Name",&local_1d9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars_3,&local_178);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&vars_2);
    (**(code **)(*local_1d8 + 0x60))(&local_128);
    (**(code **)(*local_1d8 + 0x68))(&local_b0);
    anon_unknown_0::GenerateNamespace((string *)&vars_2,&local_128,&local_b0,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"OUTPUT",&local_1d9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars_3,&local_178);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&vars_2);
    std::__cxx11::string::~string((string *)&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    (**(code **)(*local_1d8 + 0x50))(&local_1c8);
    (**(code **)(*local_1d8 + 0x58))(&local_d0);
    anon_unknown_0::GenerateNamespace((string *)&vars_2,&local_1c8,&local_d0,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"INPUT",&local_1d9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars_3,&local_178);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&vars_2);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&vars_2);
    std::__cxx11::string::~string((string *)&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    cVar3 = (**(code **)(*local_1d8 + 0x90))();
    pcVar6 = "$Name$: grpc.handleBidiStreamingCall<$INPUT$, $OUTPUT$>;\n";
    if (cVar3 == '\0') {
      cVar3 = (**(code **)(*local_1d8 + 0x78))();
      pcVar6 = "$Name$: grpc.handleUnaryCall<$INPUT$, $OUTPUT$>;\n";
      if (cVar3 != '\0') goto LAB_00258b04;
      cVar3 = (**(code **)(*local_1d8 + 0x80))();
      pcVar6 = "$Name$: grpc.handleClientStreamingCall<$INPUT$, $OUTPUT$>;\n";
      if (cVar3 != '\0') goto LAB_00258b04;
      cVar3 = (**(code **)(*local_1d8 + 0x88))();
      pcVar6 = "$Name$: grpc.handleServerStreamingCall<$INPUT$, $OUTPUT$>;\n";
      if (cVar3 != '\0') goto LAB_00258b04;
    }
    else {
LAB_00258b04:
      (*pPVar1->_vptr_Printer[2])(pPVar1,&vars_3,pcVar6);
    }
    if (local_1d8 != (long *)0x0) {
      (**(code **)(*local_1d8 + 8))();
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

grpc::string GenerateInterface(grpc_generator::File *file,
                               const grpc_generator::Service *service,
                               const grpc::string &filename) {
  grpc::string output;

  std::set<grpc::string> generated_functions;
  std::map<grpc::string, grpc::string> vars;

  vars["PATH"] = file->package();

  if (!file->package().empty()) { vars["PATH"].append("."); }

  vars["ServiceName"] = service->name();
  vars["FBSFile"] = service->name() + "_fbs";
  vars["Filename"] = filename;
  auto printer = file->CreatePrinter(&output);

  GenerateImports(service, &*printer, &vars, false);
  GenerateMainInterface(service, &*printer, &vars);
  printer->Print("\n");
  GenerateClientInterface(service, &*printer, &vars);
  printer->Print("\n");
  GenerateClientClassInterface(service, &*printer, &vars);
  return output;
}